

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

profiler_settings_t * duckdb::EraseQueryRootSettings(profiler_settings_t *settings)

{
  bool bVar1;
  undefined1 uVar2;
  profiler_settings_t *in_RDI;
  pair<std::__detail::_Node_iterator<duckdb::MetricsType,_true,_true>,_bool> pVar3;
  MetricsType *setting_1;
  iterator __end1_1;
  iterator __begin1_1;
  profiler_settings_t *__range1_1;
  MetricsType *setting;
  iterator __end1;
  iterator __begin1;
  profiler_settings_t *__range1;
  profiler_settings_t phase_timing_settings_to_erase;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  _Node_iterator_base<duckdb::MetricsType,_true> in_stack_ffffffffffffff30;
  undefined5 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  profiler_settings_t *this;
  _Node_iterator_base<duckdb::MetricsType,_true> local_a0;
  _Node_iterator_base<duckdb::MetricsType,_true> local_98;
  undefined1 *local_90;
  _Node_iterator_base<duckdb::MetricsType,_true> local_88;
  undefined1 local_80;
  MetricsType *local_68;
  _Node_iterator_base<duckdb::MetricsType,_true> local_60;
  _Node_iterator_base<duckdb::MetricsType,_true> local_58 [2];
  undefined1 local_48 [72];
  
  this = in_RDI;
  ::std::
  unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
  ::unordered_set((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                   *)0x8a05c6);
  local_58[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
       ::begin((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_60._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
       ::end((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
              *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  while (bVar1 = ::std::__detail::operator!=(local_58,&local_60), bVar1) {
    local_68 = ::std::__detail::_Node_iterator<duckdb::MetricsType,_true,_true>::operator*
                         ((_Node_iterator<duckdb::MetricsType,_true,_true> *)0x8a0622);
    uVar2 = MetricsUtils::IsOptimizerMetric(*local_68);
    if ((((bool)uVar2) ||
        (in_stack_ffffffffffffff3e = MetricsUtils::IsPhaseTimingMetric(*local_68),
        (bool)in_stack_ffffffffffffff3e)) ||
       (in_stack_ffffffffffffff3d = MetricsUtils::IsQueryGlobalMetric(*local_68),
       (bool)in_stack_ffffffffffffff3d)) {
      pVar3 = ::std::
              unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
              ::insert(this,(value_type *)
                            CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff3e,
                                                    CONCAT15(in_stack_ffffffffffffff3d,
                                                             in_stack_ffffffffffffff38))));
      in_stack_ffffffffffffff30._M_cur =
           (__node_type *)pVar3.first.super__Node_iterator_base<duckdb::MetricsType,_true>._M_cur;
      in_stack_ffffffffffffff2f = pVar3.second;
      local_88._M_cur = in_stack_ffffffffffffff30._M_cur;
      local_80 = in_stack_ffffffffffffff2f;
    }
    ::std::__detail::_Node_iterator<duckdb::MetricsType,_true,_true>::operator++
              ((_Node_iterator<duckdb::MetricsType,_true,_true> *)in_stack_ffffffffffffff30._M_cur);
  }
  local_90 = local_48;
  local_98._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
       ::begin((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_a0._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
       ::end((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
              *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  while (bVar1 = ::std::__detail::operator!=(&local_98,&local_a0), bVar1) {
    ::std::__detail::_Node_iterator<duckdb::MetricsType,_true,_true>::operator*
              ((_Node_iterator<duckdb::MetricsType,_true,_true> *)0x8a072d);
    ::std::
    unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
    ::erase((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
             *)in_stack_ffffffffffffff30._M_cur,
            (key_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    ::std::__detail::_Node_iterator<duckdb::MetricsType,_true,_true>::operator++
              ((_Node_iterator<duckdb::MetricsType,_true,_true> *)in_stack_ffffffffffffff30._M_cur);
  }
  ::std::
  unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
  ::unordered_set((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                   *)in_stack_ffffffffffffff30._M_cur,
                  (unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                   *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  ::std::
  unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
  ::~unordered_set((unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
                    *)0x8a076d);
  return in_RDI;
}

Assistant:

profiler_settings_t EraseQueryRootSettings(profiler_settings_t settings) {
	profiler_settings_t phase_timing_settings_to_erase;

	for (auto &setting : settings) {
		if (MetricsUtils::IsOptimizerMetric(setting) || MetricsUtils::IsPhaseTimingMetric(setting) ||
		    MetricsUtils::IsQueryGlobalMetric(setting)) {
			phase_timing_settings_to_erase.insert(setting);
		}
	}

	for (auto &setting : phase_timing_settings_to_erase) {
		settings.erase(setting);
	}

	return settings;
}